

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void __thiscall
duckdb::Leaf::DeprecatedVerifyAllocations
          (Leaf *this,ART *art,
          unordered_map<unsigned_char,_unsigned_long,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_long>_>_>
          *node_counts)

{
  Node ptr;
  mapped_type *pmVar1;
  uint8_t idx;
  
  idx = '\x01';
  while( true ) {
    pmVar1 = ::std::__detail::
             _Map_base<unsigned_char,_std::pair<const_unsigned_char,_unsigned_long>,_std::allocator<std::pair<const_unsigned_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_unsigned_long>,_std::allocator<std::pair<const_unsigned_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)node_counts,&idx);
    *pmVar1 = *pmVar1 + 1;
    ptr.super_IndexPointer.data = (IndexPointer)(this->ptr).super_IndexPointer.data;
    if ((ulong)ptr.super_IndexPointer.data >> 0x38 == 0) break;
    this = Node::Ref<duckdb::Leaf_const>(art,ptr,LEAF);
  }
  return;
}

Assistant:

void Leaf::DeprecatedVerifyAllocations(ART &art, unordered_map<uint8_t, idx_t> &node_counts) const {
	auto idx = Node::GetAllocatorIdx(LEAF);
	node_counts[idx]++;

	reference<const Node> ref(ptr);
	while (ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		node_counts[idx]++;
		ref = leaf.ptr;
	}
}